

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
MeshEdgebreakerDecoderImpl
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this)

{
  MeshEdgebreakerDecoderImplInterface *in_RDI;
  MeshAttributeIndicesEncodingData *this_00;
  MeshEdgebreakerTraversalValenceDecoder *this_01;
  
  MeshEdgebreakerDecoderImplInterface::MeshEdgebreakerDecoderImplInterface(in_RDI);
  in_RDI->_vptr_MeshEdgebreakerDecoderImplInterface =
       (_func_int **)&PTR__MeshEdgebreakerDecoderImpl_00272da0;
  in_RDI[1]._vptr_MeshEdgebreakerDecoderImplInterface = (_func_int **)0x0;
  this_00 = (MeshAttributeIndicesEncodingData *)(in_RDI + 2);
  std::unique_ptr<draco::CornerTable,std::default_delete<draco::CornerTable>>::
  unique_ptr<std::default_delete<draco::CornerTable>,void>
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)this_00);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x161f59);
  this_01 = (MeshEdgebreakerTraversalValenceDecoder *)(in_RDI + 6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x161f6c);
  std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::vector
            ((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
              *)0x161f7f);
  std::vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>::vector
            ((vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_> *)0x161f92);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x161fa5);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)0x161fbb);
  *(undefined4 *)&in_RDI[0x17]._vptr_MeshEdgebreakerDecoderImplInterface = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x17]._vptr_MeshEdgebreakerDecoderImplInterface + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x18]._vptr_MeshEdgebreakerDecoderImplInterface = 0xffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x161fef);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x162005);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x16201b);
  *(undefined4 *)&in_RDI[0x28]._vptr_MeshEdgebreakerDecoderImplInterface = 0;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x16203b);
  *(undefined4 *)&in_RDI[0x30]._vptr_MeshEdgebreakerDecoderImplInterface = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16205b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x162071);
  MeshAttributeIndicesEncodingData::MeshAttributeIndicesEncodingData(this_00);
  *(undefined4 *)&in_RDI[0x3e]._vptr_MeshEdgebreakerDecoderImplInterface = 0xffffffff;
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
  ::vector((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
            *)0x1620a8);
  MeshEdgebreakerTraversalValenceDecoder::MeshEdgebreakerTraversalValenceDecoder(this_01);
  return;
}

Assistant:

MeshEdgebreakerDecoderImpl<TraversalDecoder>::MeshEdgebreakerDecoderImpl()
    : decoder_(nullptr),
      last_symbol_id_(-1),
      last_vert_id_(-1),
      last_face_id_(-1),
      num_new_vertices_(0),
      num_encoded_vertices_(0),
      pos_data_decoder_id_(-1) {}